

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O0

void RigidBodyDynamics::Math::SparseFactorizeLTL(Model *model,MatrixNd *H)

{
  double dVar1;
  Scalar *pSVar2;
  reference pvVar3;
  long in_RDI;
  double dVar4;
  uint j_1;
  uint i_1;
  uint k;
  uint j;
  uint i;
  Scalar in_stack_ffffffffffffffa8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_ffffffffffffffb0;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  for (local_14 = 0; local_18 = local_14, local_14 < *(uint *)(in_RDI + 0x50);
      local_14 = local_14 + 1) {
    while (local_18 = local_18 + 1, local_18 < *(uint *)(in_RDI + 0x50)) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8,0x6a4753);
      *pSVar2 = 0.0;
    }
  }
  for (local_1c = *(uint *)(in_RDI + 0x50); local_1c != 0; local_1c = local_1c - 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8,0x6a47ad);
    dVar4 = sqrt(*pSVar2);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8,0x6a47dc);
    *pSVar2 = dVar4;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x18),
                        (ulong)local_1c);
    local_20 = *pvVar3;
    while (local_20 != 0) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8,0x6a482b);
      dVar4 = *pSVar2;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8,0x6a4855);
      dVar1 = *pSVar2;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8,0x6a4885);
      *pSVar2 = dVar4 / dVar1;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x18),
                          (ulong)local_20);
      local_20 = *pvVar3;
    }
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x18),
                        (ulong)local_1c);
    local_20 = *pvVar3;
    while (local_20 != 0) {
      local_24 = local_20;
      while (local_24 != 0) {
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           (in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8,0x6a4906);
        in_stack_ffffffffffffffb0 =
             (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)*pSVar2;
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           (in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8,0x6a4930);
        in_stack_ffffffffffffffa8 = *pSVar2;
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           (in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8,0x6a4959);
        dVar4 = -in_stack_ffffffffffffffa8 * *pSVar2 + (double)in_stack_ffffffffffffffb0;
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           (in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8,0x6a49ad);
        *pSVar2 = dVar4;
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x18),
                            (ulong)local_24);
        local_24 = *pvVar3;
      }
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x18),
                          (ulong)local_20);
      local_20 = *pvVar3;
    }
  }
  return;
}

Assistant:

RBDL_DLLAPI void SparseFactorizeLTL (Model &model, Math::MatrixNd &H) {
  for (unsigned int i = 0; i < model.qdot_size; i++) {
    for (unsigned int j = i + 1; j < model.qdot_size; j++) {
      H(i,j) = 0.;
    }
  }

  for (unsigned int k = model.qdot_size; k > 0; k--) {
    H(k - 1,k - 1) = sqrt (H(k - 1,k - 1));
    unsigned int i = model.lambda_q[k];
    while (i != 0) {
      H(k - 1,i - 1) = H(k - 1,i - 1) / H(k - 1,k - 1);
      i = model.lambda_q[i];
    }

    i = model.lambda_q[k];
    while (i != 0) {
      unsigned int j = i;
      while (j != 0) {
        H(i - 1,j - 1) = H(i - 1,j - 1) - H(k - 1,i - 1) * H(k - 1, j - 1);
        j = model.lambda_q[j];
      }
      i = model.lambda_q[i];
    }
  }
}